

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

uint32_t __thiscall
ddd::DaTrie<true,_false,_false>::excheck_
          (DaTrie<true,_false,_false> *this,Edge *edge,
          vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *blocks)

{
  pointer pBVar1;
  pointer pBVar2;
  uint32_t uVar3;
  uint32_t block_pos;
  
  if (edge->size_ == 0) {
    __assert_fail("0 < edge.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x38e,
                  "uint32_t ddd::DaTrie<true, false, false>::excheck_(const Edge &, const std::vector<BlockLink> &) [WithBLM = true, WithNLM = false, Prefix = false]"
                 );
  }
  block_pos = this->head_pos_;
  if (block_pos != 0xffffffff) {
    pBVar1 = (blocks->super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    pBVar2 = (blocks->super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>)._M_impl.
             super__Vector_impl_data._M_start;
    do {
      if ((((long)pBVar1 - (long)pBVar2 >> 4) - 1U != (ulong)block_pos) &&
         (uVar3 = excheck_in_block_(this,edge,block_pos,blocks), uVar3 != 0xffffffff)) {
        this->head_pos_ = block_pos;
        return uVar3;
      }
      block_pos = (blocks->super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>).
                  _M_impl.super__Vector_impl_data._M_start[block_pos].next;
    } while (block_pos != this->head_pos_);
  }
  return 0xffffffff;
}

Assistant:

uint32_t excheck_(const Edge& edge, const std::vector<BlockLink>& blocks) {
    assert(0 < edge.size());

    if (head_pos_ == NOT_FOUND) {
      return NOT_FOUND;
    }

    auto block_pos = head_pos_;
    auto last_block = blocks.size() - 1;

    do {
      if (last_block == block_pos) {
        continue;
      }
      auto base = excheck_in_block_(edge, block_pos, blocks);
      if (base != NOT_FOUND) {
        head_pos_ = block_pos; // update for remaining
        return base;
      }
    } while ((block_pos = blocks[block_pos].next) != head_pos_);

    return NOT_FOUND;
  }